

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  IntervalMap<int,_int,_0U> *pIVar1;
  size_type sVar2;
  FreeNode *pFVar3;
  ulong uVar4;
  uint level;
  pointer pEVar5;
  uint32_t uVar6;
  uintptr_t intWord;
  uint uVar7;
  
  pIVar1 = (this->super_const_iterator).map;
  pEVar5 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar2 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar7 = pEVar5[sVar2 - 1].offset;
  level = pIVar1->height;
  if ((ulong)level == 0) {
    uVar6 = pIVar1->rootSize;
    if (uVar6 != uVar7 + 1) {
      do {
        uVar4 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        *(undefined8 *)((long)&pIVar1->field_0 + uVar4 * 8) =
             *(undefined8 *)((long)&pIVar1->field_0 + (ulong)uVar7 * 8);
        *(undefined4 *)((long)&pIVar1->field_0 + uVar4 * 4 + 0x80) =
             *(undefined4 *)((long)&pIVar1->field_0 + (ulong)uVar7 * 4 + 0x80);
      } while (uVar6 - 1 != uVar7);
      pEVar5 = (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      uVar7 = pIVar1->rootSize - 1;
    }
    pIVar1->rootSize = uVar7;
    pEVar5->size = uVar7;
    return false;
  }
  pFVar3 = (FreeNode *)pEVar5[sVar2 - 1].node;
  uVar6 = pEVar5[sVar2 - 1].size;
  if (uVar6 == 1) {
    pFVar3->next = alloc->freeList;
    alloc->freeList = pFVar3;
    eraseNode(this,level,alloc);
    return true;
  }
  if (uVar6 == uVar7 + 1) {
    pEVar5[level].size = uVar6 - 1;
  }
  else {
    do {
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
      pFVar3[uVar4].next = pFVar3[uVar7].next;
      *(undefined4 *)((long)&pFVar3[0x10].next + uVar4 * 4) =
           *(undefined4 *)((long)&pFVar3[0x10].next + (ulong)uVar7 * 4);
    } while (uVar6 - 1 != uVar7);
    level = pIVar1->height;
    pEVar5 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar6 = pEVar5[(this->super_const_iterator).path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size;
    pEVar5[level].size = uVar6 - 1;
    if ((ulong)level == 0) {
      level = 0;
      goto LAB_004fa3bc;
    }
  }
  *(ulong *)((long)pEVar5[level - 1].node + (ulong)pEVar5[level - 1].offset * 8) =
       *(ulong *)((long)pEVar5[level - 1].node + (ulong)pEVar5[level - 1].offset * 8) &
       0xffffffffffffffc0 | (ulong)(uVar6 - 2);
LAB_004fa3bc:
  if (shouldRecomputeBounds) {
    recomputeBounds(this,level);
  }
  return false;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}